

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

int spectest::LaneCountFromType(Type type)

{
  Enum EVar1;
  Type local_10;
  int local_c;
  Type type_local;
  
  local_10.enum_ = type.enum_;
  EVar1 = wabt::Type::operator_cast_to_Enum(&local_10);
  switch(EVar1) {
  case I16:
    local_c = 8;
    break;
  case I8:
    local_c = 0x10;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/spectest-interp.cc"
                  ,0xb7,"int spectest::LaneCountFromType(Type)");
  case F64:
    local_c = 2;
    break;
  case F32:
    local_c = 4;
    break;
  case I64:
    local_c = 2;
    break;
  case I32:
    local_c = 4;
  }
  return local_c;
}

Assistant:

int LaneCountFromType(Type type) {
  switch (type) {
    case Type::I8: return 16;
    case Type::I16: return 8;
    case Type::I32: return 4;
    case Type::I64: return 2;
    case Type::F32: return 4;
    case Type::F64: return 2;
    default: assert(false); return 0;
  }
}